

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerHLSL::emit_push_constant_block(CompilerHLSL *this,SPIRVariable *var)

{
  ID *__k;
  uint uVar1;
  pointer pRVar2;
  TypedID<(spirv_cross::Types)1> *pTVar3;
  CompilerGLSL *pCVar4;
  CompilerGLSL *pCVar5;
  ID *pIVar6;
  bool bVar7;
  size_type sVar8;
  SPIRType *pSVar9;
  mapped_type *pmVar10;
  string *psVar11;
  CompilerError *this_00;
  mapped_type *pmVar12;
  pointer pRVar13;
  string *ts_2;
  uint index;
  ulong uVar14;
  char (*ts_9) [69];
  uint32_t local_100;
  uint32_t failed_index;
  ID *local_f8;
  SPIRType *local_f0;
  CompilerHLSL *local_e8;
  mapped_type *local_e0;
  ID *local_d8;
  string backup_name;
  string member_name;
  string local_70;
  string local_50 [32];
  
  backup_name._M_dataplus._M_p._0_4_ = (var->super_IVariant).self.id;
  sVar8 = ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count(&(this->super_CompilerGLSL).flattened_buffer_blocks._M_h,(key_type *)&backup_name)
  ;
  if (sVar8 == 0) {
    pRVar13 = (this->root_constants_layout).
              super__Vector_base<spirv_cross::RootConstants,_std::allocator<spirv_cross::RootConstants>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pRVar2 = (this->root_constants_layout).
             super__Vector_base<spirv_cross::RootConstants,_std::allocator<spirv_cross::RootConstants>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pRVar13 == pRVar2) {
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x21])(this,var);
    }
    else {
      local_f8 = &(var->super_IVariant).self;
      pCVar4 = &this->super_CompilerGLSL;
      pCVar5 = &this->super_CompilerGLSL;
      local_e8 = this;
      for (; pRVar13 != pRVar2; pRVar13 = pRVar13 + 1) {
        pSVar9 = Compiler::get<spirv_cross::SPIRType>
                           ((Compiler *)this,*(uint32_t *)&(var->super_IVariant).field_0xc);
        failed_index = 0;
        bVar7 = CompilerGLSL::buffer_is_packing_standard
                          (&this->super_CompilerGLSL,pSVar9,BufferPackingHLSLCbufferPackOffset,
                           &failed_index,pRVar13->start,pRVar13->end);
        local_f0 = pSVar9;
        if (!bVar7) {
          this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    (&member_name,this,(ulong)(pSVar9->super_IVariant).self.id,1);
          ts_9 = (char (*) [69])0x1943e3;
          CompilerGLSL::to_member_name_abi_cxx11_
                    (&local_70,&local_e8->super_CompilerGLSL,local_f0,failed_index);
          join<char_const(&)[26],spirv_cross::TypedID<(spirv_cross::Types)0>const&,char_const(&)[9],std::__cxx11::string,char_const(&)[2],char_const(&)[16],unsigned_int&,char_const(&)[9],std::__cxx11::string,char_const(&)[69]>
                    (&backup_name,(spirv_cross *)"Root constant cbuffer ID ",(char (*) [26])local_f8
                     ,(TypedID<(spirv_cross::Types)0> *)" (name: ",(char (*) [9])&member_name,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x27e75d,
                     (char (*) [2])0x2825cc,(char (*) [16])&failed_index,(uint *)" (name: ",
                     (char (*) [9])&local_70,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ") cannot be expressed with either HLSL packing layout or packoffset.",ts_9);
          CompilerError::CompilerError(this_00,&backup_name);
          __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        __k = &(pSVar9->super_IVariant).self;
        Compiler::set_extended_decoration
                  ((Compiler *)this,(pSVar9->super_IVariant).self.id,
                   SPIRVCrossDecorationExplicitOffset,0);
        pIVar6 = local_f8;
        backup_name._M_dataplus._M_p._0_4_ = local_f8->id;
        pmVar10 = ::std::__detail::
                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&pCVar4->flattened_structs,(key_type *)&backup_name);
        *pmVar10 = false;
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::clear(&(pSVar9->member_name_cache)._M_h);
        CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,pIVar6->id);
        local_d8 = __k;
        local_e0 = ::std::__detail::
                   _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&(pCVar5->super_Compiler).ir.meta,__k);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                  (&backup_name,this,(ulong)pIVar6->id,1);
        ts_2 = (string *)(ulong)pRVar13->binding;
        to_resource_register_abi_cxx11_
                  (&member_name,this,HLSL_BINDING_AUTO_PUSH_CONSTANT_BIT,'b',pRVar13->binding,
                   pRVar13->space);
        CompilerGLSL::statement<char_const(&)[34],std::__cxx11::string,std::__cxx11::string>
                  (&this->super_CompilerGLSL,(char (*) [34])"cbuffer SPIRV_CROSS_RootConstant_",
                   &backup_name,&member_name);
        ::std::__cxx11::string::~string((string *)&member_name);
        ::std::__cxx11::string::~string((string *)&backup_name);
        CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
        local_100 = 0;
        pmVar12 = local_e0;
        for (index = 0; pSVar9 = local_f0, uVar14 = (ulong)index,
            uVar14 < (pmVar12->members).super_VectorView<spirv_cross::Meta::Decoration>.buffer_size;
            index = index + 1) {
          uVar1 = (pmVar12->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr[uVar14].
                  offset;
          if ((pRVar13->start <= uVar1) && (uVar1 < pRVar13->end)) {
            pTVar3 = (local_f0->member_types).
                     super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr;
            CompilerGLSL::add_member_name(&this->super_CompilerGLSL,local_f0,local_100);
            psVar11 = Compiler::get_member_name_abi_cxx11_
                                ((Compiler *)this,(TypeID)(pSVar9->super_IVariant).self.id,index);
            ::std::__cxx11::string::string((string *)&backup_name,(string *)psVar11);
            CompilerGLSL::to_member_name_abi_cxx11_
                      (&member_name,&this->super_CompilerGLSL,pSVar9,index);
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                      (local_50,this,(ulong)local_f8->id,1);
            join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&>
                      (&local_70,(spirv_cross *)local_50,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x282e15
                       ,(char (*) [2])&member_name,ts_2);
            ::std::__cxx11::string::operator=((string *)&member_name,(string *)&local_70);
            ::std::__cxx11::string::~string((string *)&local_70);
            ::std::__cxx11::string::~string(local_50);
            ParsedIR::sanitize_underscores(&member_name);
            this = local_e8;
            Compiler::set_member_name
                      ((Compiler *)local_e8,(TypeID)local_d8->id,local_100,&member_name);
            uVar1 = pTVar3[uVar14].id;
            ::std::__cxx11::string::string((string *)&local_70,"",(allocator *)local_50);
            ts_2 = &local_70;
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x15])
                      (this,local_f0,(ulong)uVar1,uVar14,&local_70,(ulong)pRVar13->start);
            ::std::__cxx11::string::~string((string *)&local_70);
            Compiler::set_member_name((Compiler *)this,(TypeID)local_d8->id,local_100,&backup_name);
            local_100 = local_100 + 1;
            ::std::__cxx11::string::~string((string *)&member_name);
            ::std::__cxx11::string::~string((string *)&backup_name);
            pmVar12 = local_e0;
          }
        }
        CompilerGLSL::end_scope_decl(&this->super_CompilerGLSL);
      }
    }
  }
  else {
    CompilerGLSL::emit_buffer_block_flattened(&this->super_CompilerGLSL,var);
  }
  return;
}

Assistant:

void CompilerHLSL::emit_push_constant_block(const SPIRVariable &var)
{
	if (flattened_buffer_blocks.count(var.self))
	{
		emit_buffer_block_flattened(var);
	}
	else if (root_constants_layout.empty())
	{
		emit_buffer_block(var);
	}
	else
	{
		for (const auto &layout : root_constants_layout)
		{
			auto &type = get<SPIRType>(var.basetype);

			uint32_t failed_index = 0;
			if (buffer_is_packing_standard(type, BufferPackingHLSLCbufferPackOffset, &failed_index, layout.start,
			                               layout.end))
				set_extended_decoration(type.self, SPIRVCrossDecorationExplicitOffset);
			else
			{
				SPIRV_CROSS_THROW(join("Root constant cbuffer ID ", var.self, " (name: ", to_name(type.self), ")",
				                       ", member index ", failed_index, " (name: ", to_member_name(type, failed_index),
				                       ") cannot be expressed with either HLSL packing layout or packoffset."));
			}

			flattened_structs[var.self] = false;
			type.member_name_cache.clear();
			add_resource_name(var.self);
			auto &memb = ir.meta[type.self].members;

			statement("cbuffer SPIRV_CROSS_RootConstant_", to_name(var.self),
			          to_resource_register(HLSL_BINDING_AUTO_PUSH_CONSTANT_BIT, 'b', layout.binding, layout.space));
			begin_scope();

			// Index of the next field in the generated root constant constant buffer
			auto constant_index = 0u;

			// Iterate over all member of the push constant and check which of the fields
			// fit into the given root constant layout.
			for (auto i = 0u; i < memb.size(); i++)
			{
				const auto offset = memb[i].offset;
				if (layout.start <= offset && offset < layout.end)
				{
					const auto &member = type.member_types[i];

					add_member_name(type, constant_index);
					auto backup_name = get_member_name(type.self, i);
					auto member_name = to_member_name(type, i);
					member_name = join(to_name(var.self), "_", member_name);
					ParsedIR::sanitize_underscores(member_name);
					set_member_name(type.self, constant_index, member_name);
					emit_struct_member(type, member, i, "", layout.start);
					set_member_name(type.self, constant_index, backup_name);

					constant_index++;
				}
			}

			end_scope_decl();
		}
	}
}